

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

reference __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::iterator::operator*(iterator *this)

{
  ctrl_t *pcVar1;
  ctrl_t *pcVar2;
  slot_type *psVar3;
  slot_type *psVar4;
  slot_type *psVar5;
  ulong uVar6;
  uint uVar7;
  ctrl_t cVar8;
  slot_type *psVar9;
  slot_type *psVar10;
  ulong extraout_RDX;
  slot_type *in_RSI;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ushort uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  ctrl_t cVar18;
  ctrl_t cVar20;
  ctrl_t cVar21;
  ctrl_t cVar22;
  
  pcVar2 = this->ctrl_;
  if (pcVar2 == (ctrl_t *)0x0) {
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,std::__cxx11::string>,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
    ::iterator::operator*((iterator *)this);
LAB_0019e67f:
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,std::__cxx11::string>,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
    ::iterator::operator*((iterator *)this);
  }
  else {
    if (pcVar2 == kEmptyGroup + 0x10) goto LAB_0019e67f;
    if (kSentinel < *pcVar2) {
      return (reference)(this->field_1).slot_;
    }
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,std::__cxx11::string>,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
  ::iterator::operator*((iterator *)this);
  psVar3 = *(slot_type **)this;
  if ((psVar3 == (slot_type *)(kEmptyGroup + 0x10) || psVar3 == (slot_type *)0x0) ||
     (-1 < *(char *)psVar3)) {
    psVar4 = *(slot_type **)in_RSI;
    if ((psVar4 == (slot_type *)(kEmptyGroup + 0x10) || psVar4 == (slot_type *)0x0) ||
       (-1 < *(char *)psVar4)) {
      if (psVar3 == (slot_type *)(kEmptyGroup + 0x10) && psVar4 == (slot_type *)(kEmptyGroup + 0x10)
         ) {
LAB_0019e759:
        return (reference)CONCAT71((int7)((ulong)psVar3 >> 8),psVar3 == psVar4);
      }
      if ((psVar3 == (slot_type *)(kEmptyGroup + 0x10)) !=
          (psVar4 == (slot_type *)(kEmptyGroup + 0x10))) goto LAB_0019e775;
      if (psVar3 == (slot_type *)0x0 || psVar4 == (slot_type *)0x0) goto LAB_0019e759;
      if ((psVar4 == (slot_type *)kSooControl) == (psVar3 == (slot_type *)kSooControl)) {
        this = (iterator *)((anon_union_8_1_a8a14541_for_iterator_2 *)((long)this + 8))->slot_;
        psVar5 = ((anon_union_8_1_a8a14541_for_iterator_2 *)((long)in_RSI + 8))->slot_;
        if (psVar3 == (slot_type *)kSooControl) {
          if ((slot_type *)this == psVar5) goto LAB_0019e759;
        }
        else {
          psVar10 = psVar5;
          psVar9 = psVar4;
          in_RSI = (slot_type *)this;
          if (psVar4 < psVar3) {
            psVar10 = (slot_type *)this;
            psVar9 = psVar3;
            in_RSI = psVar5;
          }
          if ((psVar9 < in_RSI) && (in_RSI <= psVar10)) goto LAB_0019e759;
        }
      }
      container_internal::operator==();
      goto LAB_0019e76b;
    }
  }
  else {
LAB_0019e76b:
    container_internal::operator==();
  }
  container_internal::operator==();
LAB_0019e775:
  container_internal::operator==();
  uVar6 = *(ulong *)this;
  if ((uVar6 + 1 & uVar6) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  pcVar2 = ((iterator *)((long)this + 0x10))->ctrl_;
  uVar11 = extraout_RDX >> 7 ^ (ulong)pcVar2 >> 0xc;
  auVar16 = ZEXT216(CONCAT11((char)extraout_RDX,(char)extraout_RDX) & 0x7f7f);
  auVar16 = pshuflw(auVar16,auVar16,0);
  uVar12 = 0;
  do {
    uVar11 = uVar11 & uVar6;
    pcVar1 = pcVar2 + uVar11;
    cVar8 = pcVar1[0xf];
    cVar18 = auVar16[0];
    auVar19[0] = -(cVar18 == *pcVar1);
    cVar20 = auVar16[1];
    auVar19[1] = -(cVar20 == pcVar1[1]);
    cVar21 = auVar16[2];
    auVar19[2] = -(cVar21 == pcVar1[2]);
    cVar22 = auVar16[3];
    auVar19[3] = -(cVar22 == pcVar1[3]);
    auVar19[4] = -(cVar18 == pcVar1[4]);
    auVar19[5] = -(cVar20 == pcVar1[5]);
    auVar19[6] = -(cVar21 == pcVar1[6]);
    auVar19[7] = -(cVar22 == pcVar1[7]);
    auVar19[8] = -(cVar18 == pcVar1[8]);
    auVar19[9] = -(cVar20 == pcVar1[9]);
    auVar19[10] = -(cVar21 == pcVar1[10]);
    auVar19[0xb] = -(cVar22 == pcVar1[0xb]);
    auVar19[0xc] = -(cVar18 == pcVar1[0xc]);
    auVar19[0xd] = -(cVar20 == pcVar1[0xd]);
    auVar19[0xe] = -(cVar21 == pcVar1[0xe]);
    auVar19[0xf] = -(cVar22 == cVar8);
    uVar14 = (ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe | (ushort)(auVar19[0xf] >> 7) << 0xf;
    uVar13 = (uint)uVar14;
    while (uVar14 != 0) {
      uVar7 = 0;
      if (uVar13 != 0) {
        for (; (uVar13 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
        }
      }
      uVar15 = uVar7 + uVar11 & uVar6;
      if (*(int *)((long)((anon_union_8_1_a8a14541_for_iterator_2 *)&((value_type *)this)->second)
                         [2].slot_ + uVar15 * 0x28) == (in_RSI->value).first) {
        if (pcVar2 != (ctrl_t *)0x0) {
          return (reference)(pcVar2 + uVar15);
        }
        __assert_fail("ctrl != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x9ef,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, std::basic_string<char>>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, std::basic_string<char>>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<int, std::basic_string<char>>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, std::basic_string<char>>>]"
                     );
      }
      uVar14 = (ushort)(uVar13 - 1) & (ushort)uVar13;
      uVar13 = CONCAT22((short)(uVar13 - 1 >> 0x10),uVar14);
    }
    auVar17[0] = -(*pcVar1 == kEmpty);
    auVar17[1] = -(pcVar1[1] == kEmpty);
    auVar17[2] = -(pcVar1[2] == kEmpty);
    auVar17[3] = -(pcVar1[3] == kEmpty);
    auVar17[4] = -(pcVar1[4] == kEmpty);
    auVar17[5] = -(pcVar1[5] == kEmpty);
    auVar17[6] = -(pcVar1[6] == kEmpty);
    auVar17[7] = -(pcVar1[7] == kEmpty);
    auVar17[8] = -(pcVar1[8] == kEmpty);
    auVar17[9] = -(pcVar1[9] == kEmpty);
    auVar17[10] = -(pcVar1[10] == kEmpty);
    auVar17[0xb] = -(pcVar1[0xb] == kEmpty);
    auVar17[0xc] = -(pcVar1[0xc] == kEmpty);
    auVar17[0xd] = -(pcVar1[0xd] == kEmpty);
    auVar17[0xe] = -(pcVar1[0xe] == kEmpty);
    auVar17[0xf] = -(cVar8 == kEmpty);
    if ((((((((((((((((auVar17 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar17 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar17 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar17 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar17 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar17 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar17 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar17 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar17 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar17 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar17 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar17 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar17 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar17 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar17 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar8 == kEmpty) {
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::AssertNotDebugCapacity
                ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this);
      return (reference)0x0;
    }
    uVar11 = uVar11 + uVar12 + 0x10;
    uVar12 = uVar12 + 0x10;
  } while (uVar12 <= uVar6);
  __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xe37,
                "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, std::basic_string<char>>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, std::basic_string<char>>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashMapPolicy<int, std::basic_string<char>>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, std::basic_string<char>>>, K = int]"
               );
}

Assistant:

reference operator*() const {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator*()");
      return unchecked_deref();
    }